

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamMultiReaderPrivate::SetErrorString
          (BamMultiReaderPrivate *this,string *where,string *what)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::SEPARATOR_abi_cxx11_
      == '\0') {
    iVar1 = __cxa_guard_acquire(&SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                 ::SEPARATOR_abi_cxx11_);
    if (iVar1 != 0) {
      SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::SEPARATOR_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                     SEPARATOR_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                  SEPARATOR_abi_cxx11_,": ","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                    SEPARATOR_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                           SEPARATOR_abi_cxx11_);
    }
  }
  std::operator+(&local_40,where,
                 &SetErrorString(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                  SEPARATOR_abi_cxx11_);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_40,(ulong)(what->_M_dataplus)._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
    local_60 = (long *)*plVar2;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->m_errorString,(string *)&local_60);
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BamMultiReaderPrivate::SetErrorString(const std::string& where, const std::string& what) const
{
    static const std::string SEPARATOR(": ");
    m_errorString = where + SEPARATOR + what;
}